

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::addSymbolLinkageNode
          (TIntermediate *this,TIntermAggregate **linkage,TSymbol *symbol)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermSymbol *right;
  TIntermAggregate *pTVar2;
  TIntermSymbol *node;
  TAnonMember *anon;
  TVariable *variable;
  TSymbol *symbol_local;
  TIntermAggregate **linkage_local;
  TIntermediate *this_local;
  
  iVar1 = (*symbol->_vptr_TSymbol[10])();
  anon = (TAnonMember *)CONCAT44(extraout_var,iVar1);
  if (anon == (TAnonMember *)0x0) {
    iVar1 = (*symbol->_vptr_TSymbol[0xb])();
    anon = (TAnonMember *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xb0))();
  }
  right = addSymbol(this,(TVariable *)anon);
  pTVar2 = growAggregate(this,(TIntermNode *)*linkage,(TIntermNode *)right);
  *linkage = pTVar2;
  return;
}

Assistant:

void TIntermediate::addSymbolLinkageNode(TIntermAggregate*& linkage, const TSymbol& symbol)
{
    const TVariable* variable = symbol.getAsVariable();
    if (! variable) {
        // This must be a member of an anonymous block, and we need to add the whole block
        const TAnonMember* anon = symbol.getAsAnonMember();
        variable = &anon->getAnonContainer();
    }
    TIntermSymbol* node = addSymbol(*variable);
    linkage = growAggregate(linkage, node);
}